

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore.cpp
# Opt level: O2

QString * __thiscall QSystemSemaphore::key(QString *__return_storage_ptr__,QSystemSemaphore *this)

{
  QNativeIpcKeyPrivate::legacyKey
            (__return_storage_ptr__,
             &((this->d)._M_t.
               super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
               .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>._M_head_impl)->nativeKey);
  return __return_storage_ptr__;
}

Assistant:

QString QSystemSemaphore::key() const
{
    return QNativeIpcKeyPrivate::legacyKey(d->nativeKey);
}